

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::lowerSub
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Index IVar1;
  Index IVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  LocalGet *pLVar6;
  LocalGet *pLVar7;
  Binary *pBVar8;
  Block *e;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *puVar9;
  Type local_130;
  LocalGet *local_128;
  LocalGet *getLow;
  Type local_118;
  LocalSet *local_110;
  LocalSet *subHigh2;
  Type local_100;
  LocalSet *local_f8;
  LocalSet *subHigh1;
  Type local_e8;
  LocalSet *local_e0;
  LocalSet *borrowBit;
  Type local_d0;
  LocalSet *local_c8;
  LocalSet *subLow;
  undefined1 local_b8 [8];
  TempVar borrow;
  Type local_88;
  undefined1 local_80 [8];
  TempVar highResult;
  undefined1 local_58 [8];
  TempVar lowResult;
  TempVar *rightHigh_local;
  TempVar *rightLow_local;
  TempVar *leftHigh_local;
  TempVar *leftLow_local;
  Block *result_local;
  I64ToI32Lowering *this_local;
  
  lowResult.ty.id = (uintptr_t)rightHigh;
  wasm::Type::Type(&highResult.ty,i32);
  getTemp((TempVar *)local_58,this,highResult.ty);
  wasm::Type::Type(&local_88,i32);
  getTemp((TempVar *)local_80,this,local_88);
  wasm::Type::Type((Type *)&subLow,i32);
  getTemp((TempVar *)local_b8,this,(Type)subLow);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
  wasm::Type::Type(&local_d0,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,local_d0);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightLow);
  wasm::Type::Type((Type *)&borrowBit,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,(Type)borrowBit);
  pBVar8 = Builder::makeBinary(pBVar4,SubInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  local_c8 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_b8);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
  wasm::Type::Type(&local_e8,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,local_e8);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightLow);
  wasm::Type::Type((Type *)&subHigh1,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,(Type)subHigh1);
  pBVar8 = Builder::makeBinary(pBVar4,LtUInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  local_e0 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_b8);
  wasm::Type::Type(&local_100,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,local_100);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)lowResult.ty.id);
  wasm::Type::Type((Type *)&subHigh2,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,(Type)subHigh2);
  pBVar8 = Builder::makeBinary(pBVar4,AddInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  local_f8 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  puVar9 = &this->builder;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar9);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh);
  wasm::Type::Type(&local_118,i32);
  pLVar6 = Builder::makeLocalGet(pBVar5,IVar2,local_118);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_80);
  wasm::Type::Type((Type *)&getLow,i32);
  pLVar7 = Builder::makeLocalGet(pBVar5,IVar2,(Type)getLow);
  pBVar8 = Builder::makeBinary(pBVar4,SubInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  local_110 = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar8);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type(&local_130,i32);
  local_128 = Builder::makeLocalGet(pBVar3,IVar1,local_130);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  e = Builder::blockify<wasm::LocalSet*,wasm::LocalSet*,wasm::LocalSet*,wasm::LocalGet*>
                (pBVar3,(Expression *)result,(Expression *)local_c8,local_e0,local_f8,local_110,
                 local_128);
  setOutParam(this,(Expression *)e,(TempVar *)local_80);
  TempVar::~TempVar((TempVar *)local_b8);
  TempVar::~TempVar((TempVar *)local_80);
  TempVar::~TempVar((TempVar *)local_58);
  return e;
}

Assistant:

Block* lowerSub(Block* result,
                  TempVar&& leftLow,
                  TempVar&& leftHigh,
                  TempVar&& rightLow,
                  TempVar&& rightHigh) {
    TempVar lowResult = getTemp();
    TempVar highResult = getTemp();
    TempVar borrow = getTemp();
    LocalSet* subLow = builder->makeLocalSet(
      lowResult,
      builder->makeBinary(SubInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* borrowBit = builder->makeLocalSet(
      borrow,
      builder->makeBinary(LtUInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* subHigh1 = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(borrow, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32)));
    LocalSet* subHigh2 = builder->makeLocalSet(
      highResult,
      builder->makeBinary(SubInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(highResult, Type::i32)));
    LocalGet* getLow = builder->makeLocalGet(lowResult, Type::i32);
    result =
      builder->blockify(result, subLow, borrowBit, subHigh1, subHigh2, getLow);
    setOutParam(result, std::move(highResult));
    return result;
  }